

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChar.cpp
# Opt level: O2

bool xercesc_4_0::XMLChar1_1::isValidNCName(XMLCh *toCheck,XMLSize_t count)

{
  XMLCh XVar1;
  bool bVar2;
  bool bVar3;
  XMLCh *pXVar4;
  bool bVar5;
  
  if (count == 0) {
LAB_002620e4:
    bVar5 = false;
  }
  else {
    XVar1 = *toCheck;
    if ((ushort)(XVar1 + L'⠀') < 0x380) {
      if ((ushort)(toCheck[1] + L'\x2000') < 0xfc00) goto LAB_002620e4;
      pXVar4 = toCheck + 2;
    }
    else {
      if ((XVar1 == L':') || (((&fgCharCharsTable1_1)[(ushort)XVar1] & 2) == 0)) goto LAB_002620e4;
      pXVar4 = toCheck + 1;
    }
    bVar3 = false;
    do {
      while( true ) {
        bVar2 = bVar3;
        bVar5 = toCheck + count <= pXVar4;
        if (bVar5) {
          return bVar5;
        }
        XVar1 = *pXVar4;
        pXVar4 = pXVar4 + 1;
        if ((XVar1 & 0xfc00U) == 0xdc00) break;
        if ((XVar1 & 0xfc00U) == 0xd800) {
          bVar3 = true;
          if ((bool)(0xdb7f < (ushort)XVar1 | bVar2)) {
            return bVar5;
          }
        }
        else {
          if (bVar2) {
            return bVar5;
          }
          bVar3 = false;
          if (((&fgCharCharsTable1_1)[(ushort)XVar1] & 1) == 0) {
            return bVar5;
          }
        }
      }
      bVar3 = false;
    } while (bVar2);
  }
  return bVar5;
}

Assistant:

bool XMLChar1_1::isValidNCName(const   XMLCh* const    toCheck
                               , const XMLSize_t       count)
{
    if (count == 0)
        return false;

    const XMLCh* curCh = toCheck;
    const XMLCh* endPtr = toCheck + count;

    XMLCh nextCh = *curCh++;
    if ((nextCh >= 0xD800) && (nextCh <= 0xDB7F)) {
        nextCh = *curCh++;
        if ((nextCh < 0xDC00) || (nextCh > 0xDFFF))
            return false;
    }
    else if (nextCh== chColon || !(fgCharCharsTable1_1[nextCh] & gFirstNameCharMask))
            return false;

    bool    gotLeadingSurrogate = false;
    while (curCh < endPtr)
    {
        nextCh = *curCh++;

        // Deal with surrogate pairs
        if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
        {
            //  It's a leading surrogate. If we already got one, then
            //  issue an error, else set leading flag to make sure that
            //  we look for a trailing next time.
            if (nextCh > 0xDB7F || gotLeadingSurrogate)
            {
                return false;
            }
            else
                gotLeadingSurrogate = true;
        }
        else
        {
            //  If it's a trailing surrogate, make sure that we are
            //  prepared for that. Else, it's just a regular char so make
            //  sure that we were not expected a trailing surrogate.
            if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
            {
                // It's trailing, so make sure we were expecting it
                if (!gotLeadingSurrogate)
                    return false;
            }
            else
            {
                //  It's just a char, so make sure we were not expecting a
                //  trailing surrogate.
                if (gotLeadingSurrogate) {
                    return false;
                }
                // It's got to at least be a valid XML character
                else if (!(fgCharCharsTable1_1[nextCh] & gNCNameCharMask))
                {
                    return false;
                }
            }
            gotLeadingSurrogate = false;
        }
    }
    return true;
}